

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFS.hpp
# Opt level: O0

void __thiscall VFS::CVFS::CVFSFile::ReserveChunks(CVFSFile *this,size_t Count)

{
  SChunk *this_00;
  shared_ptr<VFS::CVFS::CVFSFile::SChunk> local_30;
  ulong local_20;
  size_t i;
  size_t Count_local;
  CVFSFile *this_local;
  
  i = Count;
  Count_local = (size_t)this;
  std::
  vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
  ::reserve(&this->m_Data,Count);
  for (local_20 = 0; local_20 < i; local_20 = local_20 + 1) {
    this_00 = (SChunk *)operator_new(0x10);
    SChunk::SChunk(this_00);
    std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>::shared_ptr<VFS::CVFS::CVFSFile::SChunk,void>
              (&local_30,this_00);
    std::
    vector<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>,_std::allocator<std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>_>_>
    ::push_back(&this->m_Data,&local_30);
    std::shared_ptr<VFS::CVFS::CVFSFile::SChunk>::~shared_ptr(&local_30);
  }
  return;
}

Assistant:

void ReserveChunks(size_t Count)
                    {
                        m_Data.reserve(Count);
                        for (size_t i = 0; i < Count; i++)
                            m_Data.push_back(Chunk(new SChunk()));
                    }